

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddQuadOp
          (InstructionBuilder *this,uint32_t type_id,Op opcode,uint32_t operand1,uint32_t operand2,
          uint32_t operand3,uint32_t operand4)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t res_id;
  IRContext *pIVar1;
  Instruction *pIVar2;
  Operand *local_230;
  allocator<spvtools::opt::Operand> local_21d;
  uint32_t local_21c;
  iterator local_218;
  undefined8 local_210;
  SmallVector<unsigned_int,_2UL> local_208;
  uint32_t local_1dc;
  iterator local_1d8;
  undefined8 local_1d0;
  SmallVector<unsigned_int,_2UL> local_1c8;
  uint32_t local_19c;
  iterator local_198;
  undefined8 local_190;
  SmallVector<unsigned_int,_2UL> local_188;
  uint32_t local_15c;
  iterator local_158;
  undefined8 local_150;
  SmallVector<unsigned_int,_2UL> local_148;
  Operand local_120;
  Operand OStack_f0;
  Operand OStack_c0;
  Operand OStack_90;
  iterator local_60;
  _func_int **local_58;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_50;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_38;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> newQuadOp
  ;
  uint32_t result_id;
  uint32_t operand3_local;
  uint32_t operand2_local;
  uint32_t operand1_local;
  Op opcode_local;
  uint32_t type_id_local;
  InstructionBuilder *this_local;
  
  newQuadOp._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ = 0;
  newQuadOp._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = operand3;
  if (type_id != 0) {
    pIVar1 = GetContext(this);
    newQuadOp._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ =
         IRContext::TakeNextId(pIVar1);
    if ((uint32_t)
        newQuadOp._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl == 0) {
      return (Instruction *)0x0;
    }
  }
  pIVar2 = (Instruction *)operator_new(0x70);
  pIVar1 = GetContext(this);
  res_id = (uint32_t)
           newQuadOp._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_158 = &local_15c;
  local_150 = 1;
  init_list_02._M_len = 1;
  init_list_02._M_array = local_158;
  local_15c = operand1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_148,init_list_02);
  Operand::Operand(&local_120,SPV_OPERAND_TYPE_ID,&local_148);
  local_198 = &local_19c;
  local_190 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_198;
  local_19c = operand2;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_188,init_list_01);
  Operand::Operand(&OStack_f0,SPV_OPERAND_TYPE_ID,&local_188);
  local_1dc = newQuadOp._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  local_1d8 = &local_1dc;
  local_1d0 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_1d8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1c8,init_list_00);
  Operand::Operand(&OStack_c0,SPV_OPERAND_TYPE_ID,&local_1c8);
  local_21c = operand4;
  local_218 = &local_21c;
  local_210 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_218;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_208,init_list);
  Operand::Operand(&OStack_90,SPV_OPERAND_TYPE_ID,&local_208);
  local_60 = &local_120;
  local_58 = (_func_int **)0x4;
  std::allocator<spvtools::opt::Operand>::allocator(&local_21d);
  __l._M_len = (size_type)local_58;
  __l._M_array = local_60;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_50,__l,&local_21d);
  Instruction::Instruction(pIVar2,pIVar1,opcode,type_id,res_id,&local_50);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_38,pIVar2);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_50);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_21d);
  local_230 = (Operand *)&local_60;
  do {
    local_230 = local_230 + -1;
    Operand::~Operand(local_230);
  } while (local_230 != &local_120);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_208);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1c8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_188);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_148);
  pIVar2 = AddInstruction(this,&local_38);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_38);
  return pIVar2;
}

Assistant:

Instruction* AddQuadOp(uint32_t type_id, spv::Op opcode, uint32_t operand1,
                         uint32_t operand2, uint32_t operand3,
                         uint32_t operand4) {
    uint32_t result_id = 0;
    if (type_id != 0) {
      result_id = GetContext()->TakeNextId();
      if (result_id == 0) {
        return nullptr;
      }
    }
    std::unique_ptr<Instruction> newQuadOp(new Instruction(
        GetContext(), opcode, type_id, result_id,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand1}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand2}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand3}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {operand4}}}));
    return AddInstruction(std::move(newQuadOp));
  }